

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fortran.c
# Opt level: O1

REF_STATUS
ref_fortran_init_(REF_INT *nnodes,REF_GLOB *nnodesg,REF_GLOB *l2g,REF_INT *part,REF_INT *partition,
                 REF_DBL *x,REF_DBL *y,REF_DBL *z)

{
  int iVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int local_4c;
  int *local_48;
  REF_INT *local_40;
  REF_DBL *local_38;
  
  local_38 = x;
  uVar4 = ref_mpi_create(&ref_mpi);
  if (uVar4 == 0) {
    local_48 = nnodes;
    local_40 = part;
    uVar4 = ref_grid_create(&ref_grid,ref_mpi);
    if (uVar4 == 0) {
      ref_node = ref_grid->node;
      ref_mpi_stopwatch_start(ref_grid->mpi);
      iVar1 = ref_grid->mpi->id;
      if (*partition == iVar1) {
        uVar4 = ref_node_initialize_n_global(ref_node,*nnodesg);
        pRVar3 = local_38;
        if (uVar4 == 0) {
          if (*local_48 < 1) {
            uVar4 = 0;
          }
          else {
            lVar6 = 0;
            do {
              uVar4 = ref_node_add(ref_node,l2g[lVar6] + -1,&local_4c);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c"
                       ,0x3d,"ref_fortran_init_",(ulong)uVar4,"add node");
                return uVar4;
              }
              pRVar2 = ref_node->real;
              lVar5 = (long)local_4c;
              pRVar2[lVar5 * 0xf] = pRVar3[lVar6];
              pRVar2[lVar5 * 0xf + 1] = y[lVar6];
              pRVar2[lVar5 * 0xf + 2] = z[lVar6];
              ref_node->part[lVar5] = local_40[lVar6] + -1;
              lVar6 = lVar6 + 1;
              uVar4 = 0;
            } while (lVar6 < *local_48);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c"
                 ,0x3a,"ref_fortran_init_",(ulong)uVar4,"init nnodesg");
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x38,"ref_fortran_init_","processor ids do not match",(long)*partition,(long)iVar1);
        uVar4 = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
             0x32,"ref_fortran_init_",(ulong)uVar4,"create grid");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",0x31,
           "ref_fortran_init_",(ulong)uVar4,"create mpi");
  }
  return uVar4;
}

Assistant:

REF_STATUS REF_FORT_(ref_fortran_init,
                     REF_FORTRAN_INIT)(REF_INT *nnodes, REF_GLOB *nnodesg,
                                       REF_GLOB *l2g, REF_INT *part,
                                       REF_INT *partition, REF_DBL *x,
                                       REF_DBL *y, REF_DBL *z) {
  REF_NODE ref_node;
  REF_INT node, pos;
  RSS(ref_mpi_create(&ref_mpi), "create mpi");
  RSS(ref_grid_create(&ref_grid, ref_mpi), "create grid");
  ref_node = ref_grid_node(ref_grid);

  ref_mpi_stopwatch_start(ref_grid_mpi(ref_grid));

  REIS(*partition, ref_mpi_rank(ref_grid_mpi(ref_grid)),
       "processor ids do not match");

  RSS(ref_node_initialize_n_global(ref_node, *nnodesg), "init nnodesg");

  for (node = 0; node < (*nnodes); node++) {
    RSS(ref_node_add(ref_node, l2g[node] - 1, &pos), "add node");
    ref_node_xyz(ref_node, 0, pos) = x[node];
    ref_node_xyz(ref_node, 1, pos) = y[node];
    ref_node_xyz(ref_node, 2, pos) = z[node];
    ref_node_part(ref_node, pos) = part[node] - 1;
  }

  return REF_SUCCESS;
}